

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O2

string * __thiscall
ParserProbModelXML::GetVariableName_abi_cxx11_
          (string *__return_storage_ptr__,ParserProbModelXML *this,xmlNodePtr node)

{
  long lVar1;
  char *__s;
  ostream *poVar2;
  allocator<char> local_31;
  string name;
  
  lVar1 = xmlHasProp(node,"name");
  if (lVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Warning: Attempted to extract the name of a nameless node");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&name);
  }
  else {
    __s = (char *)xmlGetProp(node,"name");
    std::__cxx11::string::string<std::allocator<char>>((string *)&name,__s,&local_31);
    lVar1 = std::__cxx11::string::find_last_not_of((char *)&name,0x52b14b);
    if ((lVar1 - 1U < name._M_string_length - 1) && (name._M_dataplus._M_p[lVar1] == ']')) {
      std::__cxx11::string::erase((ulong)&name,lVar1 - 2);
    }
    StringTools::Trim(__return_storage_ptr__,&name);
    std::__cxx11::string::~string((string *)&name);
  }
  return __return_storage_ptr__;
}

Assistant:

string ParserProbModelXML::GetVariableName(const xmlNodePtr node) const
{
    if(!xmlHasProp(node, (xmlChar*) "name")){
        cout << "Warning: Attempted to extract the name of a nameless node" << endl;
        return "";
    }
    string name = (char*) xmlGetProp(node, (xmlChar*) "name");
    size_t pos = name.find_last_not_of(" \t");
    //remove the [0]/[1] tag from the name if it exists (for older versions of OpenMarkov).
    if(pos <= name.length()-1 && pos > 0)
    {
        if(name[pos] == ']')
            name.erase(pos-2);
    }
    //remove remaining whitespace
    return StringTools::Trim(name);
}